

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv__signal_lock(void)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  undefined1 local_d;
  int local_c;
  char data;
  int r;
  
  do {
    sVar2 = read(uv__signal_lock_pipefd[0],&local_d,1);
    local_c = (int)sVar2;
    bVar4 = false;
    if (local_c < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  iVar1 = 0;
  if (local_c < 0) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int uv__signal_lock(void) {
  int r;
  char data;

  do {
    r = read(uv__signal_lock_pipefd[0], &data, sizeof data);
  } while (r < 0 && errno == EINTR);

  return (r < 0) ? -1 : 0;
}